

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  ElabSystemTaskSyntax *pEVar1;
  DeepCloneVisitor visitor;
  Token local_48;
  Token local_38;
  ArgumentListSyntax *local_28;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x60) == (SyntaxNode *)0x0) {
    local_28 = (ArgumentListSyntax *)0x0;
  }
  else {
    local_28 = (ArgumentListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x60),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ElabSystemTaskSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ArgumentListSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_48,&local_28,&local_38);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ElabSystemTaskSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ElabSystemTaskSyntax>(
        *deepClone(node.attributes, alloc),
        node.name.deepClone(alloc),
        node.arguments ? deepClone(*node.arguments, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}